

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdSignPsbt(void *handle,void *psbt_handle,char *privkey,bool has_grind_r)

{
  bool bVar1;
  undefined8 uVar2;
  byte in_CL;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Privkey privkey_obj;
  string privkey_str;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  Privkey *in_stack_fffffffffffffe18;
  Privkey *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe40;
  allocator *paVar3;
  Privkey local_170;
  Privkey local_150;
  Privkey local_130;
  allocator local_109;
  string local_108;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [48];
  undefined4 local_28;
  byte local_21;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_21 = in_CL & 1;
  local_28 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"PsbtHandle",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x1c5;
    local_80.funcname = "CfdSignPsbt";
    cfd::core::logger::warn<>(&local_80,"privkey is null or empty.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"Failed to parameter. privkey is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_68 + 0x18) == 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x1cb;
    local_c0.funcname = "CfdSignPsbt";
    cfd::core::logger::warn<>(&local_c0,"psbt is null.");
    local_e2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Failed to handle statement. psbt is null.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    local_e2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,local_20,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  cfd::core::Privkey::Privkey(&local_130);
  bVar1 = cfd::core::Privkey::HasWif(&local_108,(NetType *)0x0,(bool *)0x0);
  if (bVar1) {
    cfd::core::Privkey::FromWif(&local_150,&local_108,kCustomChain,true);
    cfd::core::Privkey::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    cfd::core::Privkey::~Privkey((Privkey *)0x5e8a81);
  }
  else {
    cfd::core::Privkey::Privkey(&local_170,&local_108,kMainnet,true);
    cfd::core::Privkey::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    cfd::core::Privkey::~Privkey((Privkey *)0x5e8b22);
  }
  cfd::core::Psbt::Sign(*(Psbt **)(local_68 + 0x18),&local_130,(bool)(local_21 & 1));
  local_4 = 0;
  cfd::core::Privkey::~Privkey((Privkey *)0x5e8b60);
  std::__cxx11::string::~string((string *)&local_108);
  return local_4;
}

Assistant:

int CfdSignPsbt(
    void* handle, void* psbt_handle, const char* privkey, bool has_grind_r) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string privkey_str(privkey);
    Privkey privkey_obj;
    if (Privkey::HasWif(privkey_str)) {
      privkey_obj = Privkey::FromWif(privkey_str);
    } else {
      privkey_obj = Privkey(privkey_str);
    }
    psbt_obj->psbt->Sign(privkey_obj, has_grind_r);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}